

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

void __thiscall
HighsHashTable<int,_std::pair<double,_int>_>::growTable
          (HighsHashTable<int,_std::pair<double,_int>_> *this)

{
  u64 uVar1;
  u64 i;
  long lVar2;
  long lVar3;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> oldMetadata;
  unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  oldEntries;
  _Head_base<0UL,_unsigned_char_*,_false> local_30;
  _Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false> local_28;
  
  local_28._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>.
       _M_head_impl;
  (this->entries)._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  .super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>._M_head_impl =
       (HighsHashTableEntry<int,_std::pair<double,_int>_> *)0x0;
  local_30._M_head_impl =
       (this->metadata)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (this->metadata)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  uVar1 = this->tableSizeMask;
  makeEmptyTable(this,uVar1 * 2 + 2);
  lVar3 = 0;
  for (lVar2 = 0; uVar1 + 1 != lVar2; lVar2 = lVar2 + 1) {
    if ((char)local_30._M_head_impl[lVar2] < '\0') {
      HighsHashTable<int,std::pair<double,int>>::
      insert<HighsHashTableEntry<int,std::pair<double,int>>>
                ((HighsHashTable<int,std::pair<double,int>> *)this,
                 (HighsHashTableEntry<int,_std::pair<double,_int>_> *)
                 ((long)&(local_28._M_head_impl)->key_ + lVar3));
    }
    lVar3 = lVar3 + 0x18;
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_30);
  std::
  unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  ::~unique_ptr((unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                 *)&local_28);
  return;
}

Assistant:

void growTable() {
    decltype(entries) oldEntries = std::move(entries);
    decltype(metadata) oldMetadata = std::move(metadata);
    u64 oldCapactiy = tableSizeMask + 1;

    makeEmptyTable(2 * oldCapactiy);

    for (u64 i = 0; i != oldCapactiy; ++i)
      if (occupied(oldMetadata[i])) insert(std::move(oldEntries.get()[i]));
  }